

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<QSettingsIniKey>::copyAppend
          (QGenericArrayOps<QSettingsIniKey> *this,QSettingsIniKey *b,QSettingsIniKey *e)

{
  qsizetype *pqVar1;
  QSettingsIniKey *pQVar2;
  long lVar3;
  Data *pDVar4;
  
  if ((b != e) && (b < e)) {
    pQVar2 = (this->super_QArrayDataPointer<QSettingsIniKey>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<QSettingsIniKey>).size;
      pDVar4 = (b->super_QString).d.d;
      pQVar2[lVar3].super_QString.d.d = pDVar4;
      pQVar2[lVar3].super_QString.d.ptr = (b->super_QString).d.ptr;
      pQVar2[lVar3].super_QString.d.size = (b->super_QString).d.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type_conflict)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>
             + 1);
        UNLOCK();
      }
      pQVar2[lVar3].position = b->position;
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<QSettingsIniKey>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }